

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_292896::NesMmuTest_read_write_byte_Test::TestBody
          (NesMmuTest_read_write_byte_Test *this)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  reference puVar4;
  pointer pIVar5;
  char *message;
  AssertHelper local_88;
  Message local_80;
  uchar local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar;
  iterator iStack_48;
  uint16_t addr;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  NesMmuTest_read_write_byte_Test *pNStack_10;
  uint8_t byte;
  NesMmuTest_read_write_byte_Test *this_local;
  
  __range1._7_1_ = 0xf0;
  pNStack_10 = this;
  get_addr_list();
  __end1 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                     ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__begin1);
  iStack_48 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                        ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__begin1);
  while (bVar2 = __gnu_cxx::
                 operator==<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                           (&__end1,&stack0xffffffffffffffb8), ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end1);
    uVar1 = *puVar4;
    pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                       (&(this->super_NesMmuTest).mmu);
    (*pIVar5->_vptr_IMmu[4])(pIVar5,(ulong)uVar1,0xf0);
    pIVar5 = std::unique_ptr<n_e_s::core::IMmu,_std::default_delete<n_e_s::core::IMmu>_>::operator->
                       (&(this->super_NesMmuTest).mmu);
    iVar3 = (*pIVar5->_vptr_IMmu[3])(pIVar5,(ulong)uVar1);
    local_71 = (uchar)iVar3;
    testing::internal::EqHelper::Compare<unsigned_char,_unsigned_char,_nullptr>
              ((EqHelper *)local_70,"byte","mmu->read_byte(addr)",(uchar *)((long)&__range1 + 7),
               &local_71);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar2) {
      testing::Message::Message(&local_80);
      message = testing::AssertionResult::failure_message((AssertionResult *)local_70);
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/nes_core-src/core/test/src/test_mmu.cpp"
                 ,0x30,message);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      testing::Message::~Message(&local_80);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end1);
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)&__begin1);
  return;
}

Assistant:

TEST_F(NesMmuTest, read_write_byte) {
    const uint8_t byte = 0xF0;

    for (uint16_t addr : get_addr_list()) {
        mmu->write_byte(addr, byte);
        EXPECT_EQ(byte, mmu->read_byte(addr));
    }
}